

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslinearlayout.cpp
# Opt level: O0

void __thiscall QGraphicsLinearLayout::~QGraphicsLinearLayout(QGraphicsLinearLayout *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  QGraphicsLayoutItem *in_RDI;
  QGraphicsLayoutItem *item;
  int i;
  QGraphicsLayoutItem *in_stack_ffffffffffffffd8;
  uint local_c;
  QGraphicsLayoutItem *pQVar3;
  
  in_RDI->_vptr_QGraphicsLayoutItem = (_func_int **)&PTR__QGraphicsLinearLayout_00d33f90;
  local_c = (*in_RDI->_vptr_QGraphicsLayoutItem[9])();
  while (local_c = local_c - 1, -1 < (int)local_c) {
    iVar2 = (*in_RDI->_vptr_QGraphicsLayoutItem[10])(in_RDI,(ulong)local_c);
    pQVar3 = (QGraphicsLayoutItem *)CONCAT44(extraout_var,iVar2);
    (*in_RDI->_vptr_QGraphicsLayoutItem[0xb])(in_RDI,(ulong)local_c);
    if (pQVar3 != (QGraphicsLayoutItem *)0x0) {
      QGraphicsLayoutItem::setParentLayoutItem(in_RDI,in_stack_ffffffffffffffd8);
      bVar1 = QGraphicsLayoutItem::ownedByLayout((QGraphicsLayoutItem *)0x9b6f3c);
      if ((bVar1) && (in_stack_ffffffffffffffd8 = pQVar3, pQVar3 != (QGraphicsLayoutItem *)0x0)) {
        (*pQVar3->_vptr_QGraphicsLayoutItem[1])();
        in_stack_ffffffffffffffd8 = pQVar3;
      }
    }
  }
  QGraphicsLayout::~QGraphicsLayout((QGraphicsLayout *)0x9b6f78);
  return;
}

Assistant:

QGraphicsLinearLayout::~QGraphicsLinearLayout()
{
    for (int i = count() - 1; i >= 0; --i) {
        QGraphicsLayoutItem *item = itemAt(i);
        // The following lines can be removed, but this removes the item
        // from the layout more efficiently than the implementation of
        // ~QGraphicsLayoutItem.
        removeAt(i);
        if (item) {
            item->setParentLayoutItem(nullptr);
            if (item->ownedByLayout())
                delete item;
        }
    }
}